

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-app.cpp
# Opt level: O3

void __thiscall
StateRecording::updateWorker(StateRecording *this,string *dataOutput,float tElapsed_s)

{
  uint __val;
  string *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer psVar9;
  undefined8 uVar10;
  uint uVar11;
  TKeyPressPosition *pTVar12;
  vector<float,_std::allocator<float>_> *pvVar13;
  pointer psVar14;
  uint uVar15;
  ulong uVar16;
  pointer pfVar17;
  uint __len;
  TWaveformF *unaff_R12;
  vector<float,_std::allocator<float>_> *unaff_R13;
  pthread_mutex_t *__mutex;
  float fVar18;
  undefined4 uVar19;
  float fVar20;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  TWaveformF waveformFFiltered;
  string __str;
  TWaveformI16 waveformThreshold;
  TWaveformI16 waveformMax;
  vector<float,_std::allocator<float>_> local_130;
  undefined8 uStack_118;
  double local_110;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  string *local_f0;
  vector<float,_std::allocator<float>_> *local_e8;
  long local_e0;
  undefined1 local_d8 [24];
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  long *local_a8 [2];
  long local_98 [2];
  vector<float,_std::allocator<float>_> *local_88;
  long local_80;
  undefined1 local_78 [24];
  undefined8 uStack_60;
  long local_58;
  TWaveformT<short> local_48;
  
  __mutex = (pthread_mutex_t *)&this->mutex;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    iVar3 = std::__throw_system_error(iVar3);
LAB_00124f8e:
    uVar10 = std::__throw_system_error(iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._16_8_ != &local_b8) {
      operator_delete((void *)local_d8._16_8_,local_b8._M_allocated_capacity + 1);
    }
    if (local_e8 != unaff_R13) {
      operator_delete(local_e8,local_d8._0_8_ + 1);
    }
    if (local_88 != unaff_R12) {
      operator_delete(local_88,local_78._0_8_ + 1);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
    pthread_mutex_unlock(local_108);
    if ((void *)local_78._16_8_ != (void *)0x0) {
      operator_delete((void *)local_78._16_8_,local_58 - local_78._16_8_);
    }
    if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(uVar10);
  }
  unaff_R12 = &this->waveformFWork;
  std::vector<float,_std::allocator<float>_>::operator=(unaff_R12,&this->waveformF);
  pthread_mutex_unlock(__mutex);
  fVar18 = 100.0;
  fVar20 = 0.0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  if ((tElapsed_s < 0.0) && (this->freqCutoff_Hz == 0)) {
    lVar4 = std::chrono::_V2::system_clock::now();
    local_108._0_4_ =
         Cipher::findBestCutoffFreq(unaff_R12,FirstOrderHighPass,16000,100.0,1000.0,100.0);
    uVar15 = (uint)(float)local_108;
    fStack_100 = extraout_XMM0_Dc;
    fStack_fc = extraout_XMM0_Dd;
    local_108._4_4_ = extraout_XMM0_Db;
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("[+] Found best freqCutoff = %d Hz, took %4.3f seconds\n",
           SUB84((double)((float)((lVar5 - lVar4) / 1000000) / 1000.0),0),(ulong)uVar15);
    fVar18 = (float)(int)(float)local_108;
    fVar20 = (float)(int)local_108._4_4_;
    fStack_100 = (float)(int)fStack_100;
    fStack_fc = (float)(int)fStack_fc;
  }
  local_108 = (pthread_mutex_t *)CONCAT44(fVar20,fVar18);
  unaff_R13 = &local_130;
  std::vector<float,_std::allocator<float>_>::vector(unaff_R13,unaff_R12);
  filter<float>(unaff_R13,FirstOrderHighPass,(float)local_108,16000);
  bVar2 = convert<float,short>(&local_130,&this->waveformI16);
  if (!bVar2) {
    puts("Conversion failed");
  }
  if ((pointer *)
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58 = 0;
  local_78._16_8_ = (void *)0x0;
  uStack_60 = 0;
  local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(this->waveformI16).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start;
  local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)(this->waveformI16).super__Vector_base<short,_std::allocator<short>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start >> 1);
  bVar2 = findKeyPresses<short>
                    ((TWaveformViewT<short> *)&local_130,&this->keyPresses,
                     (TWaveformT<short> *)(local_78 + 0x10),&local_48,8.0,0x200,0x800,true);
  if (!bVar2) {
    puts("Failed to detect keypresses");
  }
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) goto LAB_00124f8e;
  psVar14 = (this->keyPresses).
            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar9 = (this->keyPresses).
           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar9 - (long)psVar14;
  if (lVar4 == 0) {
    uVar19 = 0;
    psVar14 = psVar9;
    goto LAB_00124ee7;
  }
  local_110 = (double)((lVar4 >> 4) * -0x5555555555555555);
  uVar6 = (long)(this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((int)SUB84(local_110,0) < 1) {
    local_110 = 0.0;
  }
  else {
    pTVar12 = &psVar14->pos;
    uVar16 = 0;
    do {
      if ((long)(int)(uVar6 >> 2) + -160000 <= *pTVar12) {
        local_110 = (double)(uVar16 & 0xffffffff);
        break;
      }
      uVar16 = uVar16 + 1;
      pTVar12 = pTVar12 + 6;
    } while ((SUB84(local_110,0) & 0x7fffffff) != uVar16);
  }
  uVar15 = this->nKeysHave;
  __val = -uVar15;
  if (0 < (int)uVar15) {
    __val = uVar15;
  }
  __len = 1;
  if (9 < __val) {
    uVar16 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00124c08;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00124c08;
      }
      if (uVar11 < 10000) goto LAB_00124c08;
      uVar16 = uVar16 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_00124c08:
  local_a8[0] = local_98;
  local_108 = __mutex;
  local_f0 = dataOutput;
  std::__cxx11::string::_M_construct((ulong)local_a8,(char)__len - (char)((int)uVar15 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_a8[0]),__len,__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x1386df);
  pvVar13 = (vector<float,_std::allocator<float>_> *)(plVar7 + 2);
  if ((vector<float,_std::allocator<float>_> *)*plVar7 == pvVar13) {
    local_78._0_8_ =
         (pvVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_78._8_8_ = plVar7[3];
    local_88 = (vector<float,_std::allocator<float>_> *)local_78;
  }
  else {
    local_78._0_8_ =
         (pvVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_88 = (vector<float,_std::allocator<float>_> *)*plVar7;
  }
  local_80 = plVar7[1];
  *plVar7 = (long)pvVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
  this_00 = local_f0;
  fVar18 = (float)(ulong)((long)uVar6 >> 2) / 16000.0;
  if (10.0 <= fVar18) {
    fVar18 = 10.0;
  }
  pvVar13 = (vector<float,_std::allocator<float>_> *)(puVar8 + 2);
  if ((vector<float,_std::allocator<float>_> *)*puVar8 == pvVar13) {
    local_d8._0_8_ =
         (pvVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_d8._8_4_ = *(undefined4 *)(puVar8 + 3);
    local_d8._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
    local_e8 = (vector<float,_std::allocator<float>_> *)local_d8;
  }
  else {
    local_d8._0_8_ =
         (pvVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_e8 = (vector<float,_std::allocator<float>_> *)*puVar8;
  }
  local_e0 = puVar8[1];
  *puVar8 = pvVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_110 = (double)(((float)(int)(uVar15 - local_110._0_4_) * 60.0) / fVar18);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d8 + 0x10),
             vsnprintf,0x3a,"%f");
  pfVar17 = (pointer)0xf;
  if (local_e8 != (vector<float,_std::allocator<float>_> *)local_d8) {
    pfVar17 = (pointer)local_d8._0_8_;
  }
  if (pfVar17 < (pointer)(local_c0 + local_e0)) {
    uVar10 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._16_8_ != &local_b8) {
      uVar10 = local_b8._M_allocated_capacity;
    }
    if ((ulong)uVar10 < (pointer)(local_c0 + local_e0)) goto LAB_00124dc6;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(local_d8 + 0x10),0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_00124dc6:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,local_d8._16_8_);
  }
  local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  plVar7 = puVar8 + 2;
  if ((pointer *)*puVar8 == (pointer *)plVar7) {
    local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar7;
    uStack_118 = puVar8[3];
  }
  else {
    local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar7;
    local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar8;
  }
  local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_130);
  if ((pointer *)
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  __mutex = local_108;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._16_8_ != &local_b8) {
    operator_delete((void *)local_d8._16_8_,local_b8._M_allocated_capacity + 1);
  }
  if (local_e8 != (vector<float,_std::allocator<float>_> *)local_d8) {
    operator_delete(local_e8,local_d8._0_8_ + 1);
  }
  if (local_88 != (vector<float,_std::allocator<float>_> *)local_78) {
    operator_delete(local_88,local_78._0_8_ + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  psVar9 = (this->keyPresses).
           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar19 = SUB84(local_110,0);
  psVar14 = (this->keyPresses).
            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
LAB_00124ee7:
  iVar3 = (int)((ulong)((long)psVar14 - (long)psVar9) >> 4);
  uVar15 = iVar3 * -0x55555555;
  if (this->nKeysHave < (int)uVar15) {
    this->nKeysHave = uVar15;
    printf("    Detected %d keys. %d left. Average typing speed: %5.2f cpm\n",uVar19,(ulong)uVar15,
           (ulong)(uint)(this->nKeysToCapture + iVar3 * 0x55555555));
  }
  if (120.0 < tElapsed_s) {
    puts("[!] Recording limit reached");
    LOCK();
    (this->doneRecording)._M_base._M_i = true;
    UNLOCK();
  }
  pthread_mutex_unlock(__mutex);
  if ((void *)local_78._16_8_ != (void *)0x0) {
    operator_delete((void *)local_78._16_8_,local_58 - local_78._16_8_);
  }
  if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void updateWorker(std::string & dataOutput, float tElapsed_s) {
        {
            std::lock_guard lock(mutex);
            waveformFWork = waveformF;
        }
        {
            auto freqCutoffCur_Hz = freqCutoff_Hz;

            if (tElapsed_s < 0.0f && freqCutoffCur_Hz == 0) {
                const auto tStart = std::chrono::high_resolution_clock::now();

                freqCutoffCur_Hz = Cipher::findBestCutoffFreq(waveformFWork, EAudioFilter::FirstOrderHighPass, kSampleRate, 100.0f, 1000.0f, 100.0f);

                const auto tEnd = std::chrono::high_resolution_clock::now();
                printf("[+] Found best freqCutoff = %d Hz, took %4.3f seconds\n", freqCutoffCur_Hz, toSeconds(tStart, tEnd));
            } else {
                freqCutoffCur_Hz = kFreqCutoff_Hz;
            }

            // apply default filtering, because keypress detection without it is impossible
            auto waveformFFiltered = waveformFWork;
            ::filter(waveformFFiltered, EAudioFilter::FirstOrderHighPass, freqCutoffCur_Hz, kSampleRate);

            if (convert(waveformFFiltered, waveformI16) == false) {
                printf("Conversion failed\n");
            }
        }

        TWaveformI16 waveformMax;
        TWaveformI16 waveformThreshold;
        if (findKeyPresses(getView(waveformI16, 0), keyPresses, waveformThreshold, waveformMax,
                           kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
            printf("Failed to detect keypresses\n");
        }

        {
            std::lock_guard lock(mutex);

            float cpm = 0.0f;
            if (keyPresses.size() > 0) {
                int idx = 0;
                while (idx < (int) keyPresses.size() && keyPresses[idx].pos < ((int) waveformF.size() - 10*kSampleRate)) {
                    ++idx;
                }
                cpm = 60.0f*(nKeysHave - idx)/std::min(10.0f, (float) waveformF.size()/kSampleRate);
                dataOutput = "recording " + std::to_string(nKeysHave) + " " + std::to_string(cpm);
            }

            if (nKeysHave < (int) keyPresses.size()) {
                nKeysHave = keyPresses.size();

                printf("    Detected %d keys. %d left. Average typing speed: %5.2f cpm\n", nKeysHave, nKeysToCapture - nKeysHave, cpm);
            }

            if (tElapsed_s > 2*60.0f) {
                printf("[!] Recording limit reached\n");
                doneRecording = true;
            }
        }
    }